

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O3

void __thiscall CVmObjDict::set_comparator_type(CVmObjDict *this,vm_obj_id_t obj)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  
  if (obj == 0) {
    pcVar1 = (this->super_CVmObject).ext_;
    pcVar1[0x30] = '\0';
    pcVar1[0x31] = '\0';
    pcVar1[0x32] = '\0';
    pcVar1[0x33] = '\0';
    lVar3 = 0;
  }
  else {
    lVar3 = (ulong)((obj & 0xfff) << 3) * 3;
    iVar2 = (**(code **)(*(long *)((long)&G_obj_table_X.pages_[obj >> 0xc]->ptr_ + lVar3) + 8))
                      ((long)&G_obj_table_X.pages_[obj >> 0xc]->ptr_ + lVar3,
                       CVmObjStrComp::metaclass_reg_);
    *(uint *)((this->super_CVmObject).ext_ + 0x30) = (iVar2 == 0) + 1;
    lVar3 = (long)&G_obj_table_X.pages_[obj >> 0xc]->ptr_ + lVar3;
  }
  *(long *)((this->super_CVmObject).ext_ + 0x28) = lVar3;
  return;
}

Assistant:

void CVmObjDict::set_comparator_type(VMG_ vm_obj_id_t obj)
{
    /* check what kind of object we have */
    if (obj == VM_INVALID_OBJ)
    {
        /* there's no comparator at all, so simply use an exact comparison */
        get_ext()->comparator_type_ = VMDICT_COMP_NONE;
    }
    else if (CVmObjStrComp::is_strcmp_obj(vmg_ obj))
    {
        /* it's a StringComparator */
        get_ext()->comparator_type_ = VMDICT_COMP_STRCOMP;
    }
    else
    {
        /* it's a generic comparator object */
        get_ext()->comparator_type_ = VMDICT_COMP_GENERIC;
    }